

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  Select *pSVar1;
  Expr *pExpr;
  int iVar2;
  int iVar3;
  FuncDef *pFVar4;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    iVar2 = sqlite3ExprCompare(pParse,pE1,pE2,iTab);
    iVar3 = 1;
    if (((iVar2 == 0) ||
        ((pE2->op == '+' &&
         ((iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab), iVar2 != 0 ||
          (iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab), iVar2 != 0)))))) ||
       ((pE2->op == '4' && (iVar2 = exprImpliesNotNull(pParse,pE1,pE2->pLeft,iTab,0), iVar2 != 0))))
    goto LAB_0017d21e;
    iVar2 = 0;
    if (pE1->op == 0x9e) {
      iVar3 = iVar2;
      if (pE1->pLeft != (Expr *)0x0) goto LAB_0017d21e;
    }
    else {
      iVar3 = 0;
      if (((pE1->op != 0xac) || (iVar3 = iVar2, (byte)(*(pE1->u).zToken | 0x20U) != 0x69)) ||
         ((pE1->x).pList == (ExprList *)0x0)) {
LAB_0017d21e:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return iVar3;
      }
      iVar3 = 0;
      pFVar4 = sqlite3FindFunction(pParse->db,(pE1->u).zToken,((pE1->x).pList)->nExpr,
                                   pParse->db->enc,'\0');
      if (((pFVar4 == (FuncDef *)0x0) || ((pFVar4->funcFlags & 0x400000) == 0)) ||
         (*(int *)&pFVar4->pUserData != 5)) goto LAB_0017d21e;
    }
    pSVar1 = (pE1->x).pSelect;
    iVar2._0_1_ = pSVar1->op;
    iVar2._1_1_ = pSVar1->field_0x1;
    iVar2._2_2_ = pSVar1->nSelectRow;
    if (iVar2 != 2) {
      iVar3 = 0;
      if (iVar2 != 3) goto LAB_0017d21e;
      pExpr = (Expr *)pSVar1->pGroupBy;
      local_3c = -0x55555556;
      if ((pExpr->op != 'z') &&
         ((pExpr->op != 0xab || (iVar3 = sqlite3ExprTruthValue(pExpr), iVar3 != 0)))) {
        local_3c = 1;
        iVar2 = sqlite3ExprIsInteger(pExpr,&local_3c,(Parse *)0x0);
        iVar3 = 0;
        if ((iVar2 == 0) || (local_3c != 0)) goto LAB_0017d21e;
      }
    }
    pE1 = ((pE1->x).pList)->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(
  const Parse *pParse,
  const Expr *pE1,
  const Expr *pE2,
  int iTab
){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL
   && exprImpliesNotNull(pParse, pE1, pE2->pLeft, iTab, 0)
  ){
    return 1;
  }
  if( sqlite3ExprIsIIF(pParse->db, pE1) ){
    return sqlite3ExprImpliesExpr(pParse,pE1->x.pList->a[0].pExpr,pE2,iTab);
  }
  return 0;
}